

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

void hts_idx_finish(hts_idx_t *idx,uint64_t final_offset)

{
  bins_t *pbVar1;
  uint64_t *puVar2;
  kh_bin_t *h;
  bins_t *pbVar3;
  bins_t *pbVar4;
  ulong uVar5;
  uint64_t uVar6;
  khint_t kVar7;
  int iVar8;
  uint uVar9;
  khint_t kVar10;
  long lVar11;
  hts_pair64_t *phVar12;
  int32_t iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  hts_pair64_t *phVar18;
  long lVar19;
  uint uVar20;
  
  if ((idx != (hts_idx_t *)0x0) && ((idx->z).finished == 0)) {
    lVar11 = (long)(idx->z).save_tid;
    if (-1 < lVar11) {
      insert_to_b(idx->bidx[lVar11],(idx->z).save_bin,(idx->z).save_off,final_offset);
      insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).off_beg,final_offset);
      insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).n_mapped,(idx->z).n_unmapped
                 );
    }
    for (lVar11 = 0; lVar11 < idx->n; lVar11 = lVar11 + 1) {
      update_loff(idx,(int)lVar11,(uint)(idx->fmt == 0));
      h = idx->bidx[lVar11];
      if (h != (kh_bin_t *)0x0) {
        for (iVar17 = idx->n_lvls; 0 < iVar17; iVar17 = iVar17 + -1) {
          uVar14 = 0;
          uVar15 = 0;
          while( true ) {
            kVar10 = (khint_t)uVar15;
            if (kVar10 == h->n_buckets) break;
            uVar20 = 3 << (sbyte)(uVar14 & 0x1e);
            uVar5 = uVar15 >> 4;
            if ((((h->flags[uVar5] & uVar20) == 0) && (h->keys[uVar15] < (uint)idx->n_bins)) &&
               ((uint)~(-1 << ((char)iVar17 * '\x03' & 0x1fU)) / 7 <= h->keys[uVar15])) {
              pbVar3 = h->vals;
              if ((iVar17 < idx->n_lvls) && (1 < (long)pbVar3[uVar15].n)) {
                ks_introsort__off((long)pbVar3[uVar15].n,pbVar3[uVar15].list);
              }
              phVar18 = pbVar3[uVar15].list;
              iVar8 = pbVar3[uVar15].n;
              lVar19 = (long)iVar8;
              if ((phVar18[lVar19 + -1].v >> 0x10) - (phVar18->u >> 0x10) < 0x10000) {
                kVar7 = kh_get_bin(h,h->keys[uVar15] - 1 >> 3);
                if (kVar7 != h->n_buckets) {
                  pbVar4 = h->vals;
                  pbVar1 = pbVar4 + kVar7;
                  iVar13 = pbVar4[kVar7].n;
                  iVar8 = iVar13 + iVar8;
                  if (pbVar4[kVar7].m < iVar8) {
                    uVar9 = iVar8 - 1;
                    uVar9 = (int)uVar9 >> 1 | uVar9;
                    uVar9 = (int)uVar9 >> 2 | uVar9;
                    uVar9 = (int)uVar9 >> 4 | uVar9;
                    uVar9 = (int)uVar9 >> 8 | uVar9;
                    uVar9 = (int)uVar9 >> 0x10 | uVar9;
                    pbVar1->m = uVar9 + 1;
                    phVar12 = (hts_pair64_t *)realloc(pbVar1->list,(long)(int)uVar9 * 0x10 + 0x10);
                    pbVar1->list = phVar12;
                    iVar13 = pbVar1->n;
                    phVar18 = pbVar3[uVar15].list;
                    lVar19 = (long)pbVar3[uVar15].n;
                  }
                  else {
                    phVar12 = pbVar1->list;
                  }
                  memcpy(phVar12 + iVar13,phVar18,lVar19 << 4);
                  pbVar1->n = pbVar1->n + pbVar3[uVar15].n;
                  free(pbVar3[uVar15].list);
                  if (kVar10 != h->n_buckets) {
                    uVar9 = h->flags[uVar5];
                    if ((uVar9 & uVar20) == 0) {
                      h->flags[uVar5] = uVar9 | 1 << (uVar14 & 0x1e);
                      h->size = h->size - 1;
                    }
                  }
                }
              }
            }
            uVar15 = (ulong)(kVar10 + 1);
            uVar14 = uVar14 + 2;
          }
        }
        kVar10 = kh_get_bin(h,0);
        if (kVar10 != h->n_buckets) {
          ks_introsort__off((long)h->vals[kVar10].n,h->vals[kVar10].list);
        }
        for (uVar14 = 0; uVar14 != h->n_buckets; uVar14 = uVar14 + 1) {
          if (((h->flags[uVar14 >> 4] >> ((char)uVar14 * '\x02' & 0x1fU) & 3) == 0) &&
             (h->keys[uVar14] < (uint)idx->n_bins)) {
            pbVar3 = h->vals;
            iVar17 = 0;
            lVar19 = 0x10;
            for (lVar16 = 1; lVar16 < pbVar3[uVar14].n; lVar16 = lVar16 + 1) {
              phVar18 = pbVar3[uVar14].list;
              if (phVar18[iVar17].v >> 0x10 < *(ulong *)((long)&phVar18->u + lVar19) >> 0x10) {
                puVar2 = (uint64_t *)((long)&phVar18->u + lVar19);
                uVar6 = puVar2[1];
                phVar18[(long)iVar17 + 1].u = *puVar2;
                phVar18[(long)iVar17 + 1].v = uVar6;
                iVar17 = iVar17 + 1;
              }
              else {
                uVar15 = *(ulong *)((long)&phVar18->v + lVar19);
                if (phVar18[iVar17].v < uVar15) {
                  phVar18[iVar17].v = uVar15;
                }
              }
              lVar19 = lVar19 + 0x10;
            }
            pbVar3[uVar14].n = iVar17 + 1;
          }
        }
      }
    }
    (idx->z).finished = 1;
    return;
  }
  return;
}

Assistant:

void hts_idx_finish(hts_idx_t *idx, uint64_t final_offset)
{
    int i;
    if (idx == NULL || idx->z.finished) return; // do not run this function on an empty index or multiple times
    if (idx->z.save_tid >= 0) {
        insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
    }
    for (i = 0; i < idx->n; ++i) {
        update_loff(idx, i, (idx->fmt == HTS_FMT_CSI));
        compress_binning(idx, i);
    }
    idx->z.finished = 1;
}